

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O0

Attachment *
deqp::gls::fboc::details::makeAttachment
          (GLenum bufType,ImageFormat format,GLsizei width,GLsizei height,FboBuilder *builder)

{
  Image *pIVar1;
  Texture *local_88;
  Renderbuffer *local_78;
  TextureFlatAttachment *texAtt;
  Texture2D *texCfg;
  Renderbuffer *rboCfg;
  RenderbufferAttachment *pRStack_48;
  GLuint img;
  Attachment *att;
  Image *imgCfg;
  FboBuilder *builder_local;
  GLsizei height_local;
  GLsizei width_local;
  GLenum bufType_local;
  ImageFormat format_local;
  
  pIVar1 = makeImage(bufType,format,width,height,builder);
  if (pIVar1 == (Image *)0x0) {
    local_78 = (Renderbuffer *)0x0;
  }
  else {
    local_78 = (Renderbuffer *)
               __dynamic_cast(pIVar1,&FboUtil::config::Image::typeinfo,
                              &FboUtil::config::Renderbuffer::typeinfo,0);
  }
  if (local_78 == (Renderbuffer *)0x0) {
    if (pIVar1 == (Image *)0x0) {
      local_88 = (Texture *)0x0;
    }
    else {
      local_88 = (Texture *)
                 __dynamic_cast(pIVar1,&FboUtil::config::Image::typeinfo,
                                &FboUtil::config::Texture2D::typeinfo,0);
    }
    if (local_88 == (Texture *)0x0) {
      return (Attachment *)0x0;
    }
    rboCfg._4_4_ = FboUtil::FboBuilder::glCreateTexture(builder,local_88);
    pRStack_48 = (RenderbufferAttachment *)
                 FboUtil::FboBuilder::makeConfig<deqp::gls::FboUtil::config::TextureFlatAttachment>
                           (builder);
    *(undefined4 *)&pRStack_48->field_0x14 = 0xde1;
  }
  else {
    rboCfg._4_4_ = FboUtil::FboBuilder::glCreateRbo(builder,local_78);
    pRStack_48 = FboUtil::FboBuilder::makeConfig<deqp::gls::FboUtil::config::RenderbufferAttachment>
                           (builder);
  }
  (pRStack_48->super_Attachment).imageName = rboCfg._4_4_;
  return &pRStack_48->super_Attachment;
}

Assistant:

Attachment* makeAttachment (GLenum bufType, ImageFormat format,
							GLsizei width, GLsizei height, FboBuilder& builder)
{
	Image* const imgCfg = makeImage (bufType, format, width, height, builder);
	Attachment* att = DE_NULL;
	GLuint img = 0;

	if (Renderbuffer* rboCfg = dynamic_cast<Renderbuffer*>(imgCfg))
	{
		img = builder.glCreateRbo(*rboCfg);
		att = &builder.makeConfig<RenderbufferAttachment>();
	}
	else if (Texture2D* texCfg = dynamic_cast<Texture2D*>(imgCfg))
	{
		img = builder.glCreateTexture(*texCfg);
		TextureFlatAttachment& texAtt = builder.makeConfig<TextureFlatAttachment>();
		texAtt.texTarget = GL_TEXTURE_2D;
		att = &texAtt;
	}
	else
	{
		DE_ASSERT(imgCfg == DE_NULL);
		return DE_NULL;
	}
	att->imageName = img;
	return att;
}